

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O0

void __thiscall
tlx::CmdlineParser::print_param_error
          (CmdlineParser *this,int argc,char **argv,Argument *arg,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  void *this_00;
  char *local_90;
  string local_50;
  ostream *local_30;
  ostream *os_local;
  Argument *arg_local;
  char **argv_local;
  CmdlineParser *pCStack_10;
  int argc_local;
  CmdlineParser *this_local;
  
  local_30 = os;
  os_local = (ostream *)arg;
  arg_local = (Argument *)argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::operator<<(os,"Error: argument ");
  if (argv_local._4_4_ != 0) {
    poVar1 = std::operator<<(local_30,'\"');
    poVar1 = std::operator<<(poVar1,(char *)arg_local->_vptr_Argument);
    std::operator<<(poVar1,'\"');
  }
  poVar1 = std::operator<<(local_30," for ");
  pcVar2 = (char *)(**(code **)(*(long *)os_local + 0x10))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," parameter ");
  Argument::param_text_abi_cxx11_(&local_50,(Argument *)os_local);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  if (argv_local._4_4_ == 0) {
    local_90 = " is missing!";
  }
  else {
    local_90 = " is invalid!";
  }
  poVar1 = std::operator<<(poVar1,local_90);
  this_00 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_50);
  print_usage(this,local_30);
  return;
}

Assistant:

void CmdlineParser::print_param_error(
    int argc, const char* const* argv, const Argument* arg, std::ostream& os) {
    os << "Error: argument ";
    if (argc != 0)
        os << '"' << argv[0] << '"';

    os << " for " << arg->type_name() << " parameter " << arg->param_text()
       << (argc == 0 ? " is missing!" : " is invalid!") << std::endl
       << std::endl;

    print_usage(os);
}